

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8dup(void *src)

{
  size_t __size;
  void *in_RDI;
  size_t bytes;
  char *n;
  char *s;
  undefined8 local_28;
  undefined8 local_8;
  
  __size = utf8size(in_RDI);
  local_8 = malloc(__size);
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    for (local_28 = 0; *(char *)((long)in_RDI + local_28) != '\0'; local_28 = local_28 + 1) {
      *(undefined1 *)((long)local_8 + local_28) = *(undefined1 *)((long)in_RDI + local_28);
    }
    *(undefined1 *)((long)local_8 + local_28) = 0;
  }
  return local_8;
}

Assistant:

void *utf8dup(const void *src) {
  const char *s = (const char *)src;
  char *n = 0;

  // figure out how many bytes (including the terminator) we need to copy first
  size_t bytes = utf8size(src);

  n = (char *)malloc(bytes);

  if (0 == n) {
    // out of memory so we bail
    return 0;
  } else {
    bytes = 0;

    // copy src byte-by-byte into our new utf8 string
    while ('\0' != s[bytes]) {
      n[bytes] = s[bytes];
      bytes++;
    }

    // append null terminating byte
    n[bytes] = '\0';
    return n;
  }
}